

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

double __thiscall uttt::EvalMcts::operator()(EvalMcts *this,IBoard *board)

{
  IPlayer IVar1;
  int iVar2;
  MCTSResults *result;
  longlong in_RCX;
  double dVar3;
  double dVar4;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  
  iVar2 = IBoard::GetStatus(board);
  if (iVar2 == -1) {
    mcts::MCTS_parallel<uttt::IBoard,mcts::RandomPlayout<uttt::IBoard>>
              (&results,(mcts *)board,(IBoard *)0x64,in_RCX);
    dVar3 = -1.1;
    for (; results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl
           .super__Vector_impl_data._M_start !=
           results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl
           .super__Vector_impl_data._M_finish;
        results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
        super__Vector_impl_data._M_start =
             results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) {
      dVar4 = (results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
               _M_impl.super__Vector_impl_data._M_start)->value /
              (double)(results.
                       super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                       _M_impl.super__Vector_impl_data._M_start)->total;
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
    std::_Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~_Vector_base
              (&results.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>);
  }
  else {
    dVar3 = 0.0;
    if (iVar2 != 0) {
      IVar1 = IBoard::GetPlayerToMove(board);
      if (iVar2 == IVar1) {
        dVar3 = 1.79769313486232e+308;
      }
      else {
        dVar3 = -1.79769313486232e+308;
      }
    }
  }
  return dVar3;
}

Assistant:

double
EvalMcts::operator()(const IBoard &board) const
{
    int status = board.GetStatus();
    if (status == game::Draw)
        return 0.0;
    if (status != game::Undecided)
    {
        if (board.GetPlayerToMove() == status)
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }
    auto results = mcts::MCTS_parallel<IBoard>(board, 100);
    double max = -1.1;
    for (const auto &result : results)
        max = std::max(max, result.value / result.total);
    return max;
}